

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void __thiscall
FFTAnalyzer::AnalyzeInput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float local_48;
  int local_34;
  float a;
  int n_3;
  int n_2;
  int n_1;
  int n;
  float decaySpeed_local;
  int numsamples_local;
  int numchannels_local;
  float *data_local;
  FFTAnalyzer *this_local;
  
  CheckInitialized(this);
  for (n_2 = 0; n_2 < this->spectrumSize - numsamples; n_2 = n_2 + 1) {
    this->ibuffer[n_2] = this->ibuffer[n_2 + numsamples];
  }
  for (n_3 = 0; n_3 < numsamples; n_3 = n_3 + 1) {
    this->ibuffer[(n_3 + this->spectrumSize) - numsamples] = data[n_3 * numchannels];
  }
  for (a = 0.0; (int)a < this->spectrumSize; a = (float)((int)a + 1)) {
    UnityComplexNumberT<float>::Set
              (this->cspec + (int)a,this->ibuffer[(int)a] * this->window[(int)a],0.0);
  }
  FFT::Forward(this->cspec,this->spectrumSize,true);
  for (local_34 = 0; local_34 < this->spectrumSize / 2; local_34 = local_34 + 1) {
    local_48 = UnityComplexNumberT<float>::Magnitude(this->cspec + local_34);
    if (local_48 < this->ispec2[local_34] || local_48 == this->ispec2[local_34]) {
      local_48 = this->ispec2[local_34] * decaySpeed;
    }
    this->ispec1[local_34] = local_48;
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeInput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        ibuffer[n] = ibuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        ibuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(ibuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ispec1[n] = (a > ispec2[n]) ? a : ispec2[n] * decaySpeed;
    }
}